

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_top_predictor_64x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  ushort uVar6;
  ushort uVar13;
  ushort uVar15;
  ushort uVar16;
  undefined1 extraout_XMM0 [14];
  ushort uVar17;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  __m128i row;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 uVar12;
  byte bVar14;
  
  dc_sum_64(above);
  uVar6 = extraout_XMM0._0_2_ + 0x20;
  uVar13 = extraout_XMM0._2_2_ + 0x20;
  uVar15 = extraout_XMM0._4_2_ + 0x20;
  uVar16 = extraout_XMM0._6_2_ + 0x20;
  auVar7._0_2_ = uVar6 >> 6;
  uVar17 = uVar16 >> 6;
  uVar1 = CONCAT22((ushort)(extraout_XMM0._8_2_ + 0x20U) >> 6,uVar17);
  auVar8._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(extraout_XMM0._10_2_ + 0x20U) >> 6,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar9._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(extraout_XMM0._12_2_ + 0x20U) >> 6,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar10._0_13_ = auVar5 << 0x30;
  bVar14 = (byte)(uVar16 >> 8);
  auVar10._14_2_ = (undefined2)(CONCAT19(bVar14 >> 6,CONCAT18(bVar14 >> 6,uVar3)) >> 0x40);
  auVar10[0xd] = (char)uVar17;
  bVar14 = (byte)(uVar15 >> 0xe);
  auVar9._12_4_ = (undefined4)(CONCAT37(auVar10._13_3_,CONCAT16((char)uVar17,uVar2)) >> 0x30);
  auVar9[0xb] = bVar14;
  uVar12 = (undefined1)(uVar15 >> 6);
  auVar8._10_6_ = (undefined6)(CONCAT55(auVar9._11_5_,CONCAT14(bVar14,uVar1)) >> 0x20);
  auVar8[9] = uVar12;
  bVar14 = (byte)(uVar13 >> 0xe);
  auVar7._8_8_ = (undefined8)(CONCAT73(auVar8._9_7_,CONCAT12(uVar12,uVar17)) >> 0x10);
  auVar7[7] = bVar14;
  auVar7[6] = bVar14;
  uVar12 = (undefined1)(uVar13 >> 6);
  auVar7[5] = uVar12;
  auVar7[4] = uVar12;
  bVar14 = (byte)(uVar6 >> 8);
  auVar7[3] = bVar14 >> 6;
  auVar7[2] = bVar14 >> 6;
  auVar11[0] = (undefined1)auVar7._0_2_;
  auVar11._2_14_ = auVar7._2_14_;
  auVar11[1] = auVar11[0];
  auVar11 = pshuflw(auVar11,auVar11,0);
  row[0]._0_4_ = auVar11._0_4_;
  row[0]._4_4_ = (undefined4)row[0];
  row[1]._0_4_ = (undefined4)row[0];
  row[1]._4_4_ = (undefined4)row[0];
  dc_store_64xh(&row,0x10,dst,stride);
  return;
}

Assistant:

void aom_dc_top_predictor_64x16_sse2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  (void)left;
  __m128i sum_above = dc_sum_64(above);
  const __m128i thirtytwo = _mm_set1_epi16(32);
  sum_above = _mm_add_epi16(sum_above, thirtytwo);
  sum_above = _mm_srai_epi16(sum_above, 6);
  sum_above = _mm_unpacklo_epi8(sum_above, sum_above);
  sum_above = _mm_shufflelo_epi16(sum_above, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_above, sum_above);
  dc_store_64xh(&row, 16, dst, stride);
}